

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::apps::App::generateParser(App *this)

{
  App *pAVar1;
  _func_int **pp_Var2;
  Option *pOVar3;
  long in_RSI;
  allocator<char> local_1a3;
  allocator<char> local_1a2;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_a0;
  Validator local_80;
  
  std::make_unique<helics::helicsCLI11App,char_const(&)[35],char_const(&)[13]>
            ((char (*) [35])this,(char (*) [13])"Common options for all Helics Apps");
  helicsCLI11App::add_config_validation((helicsCLI11App *)this->_vptr_App);
  pAVar1 = (App *)this->_vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"--local",(allocator<char> *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c0,
             "Specify otherwise unspecified endpoints and publications as local (i.e. the names will be prepended with the app name)"
             ,&local_1a3);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (pAVar1,&local_a0,(bool *)(in_RSI + 0x80),&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  pAVar1 = (App *)this->_vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,"--stop",(allocator<char> *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"The time to stop the app",&local_1a3);
  CLI::App::
  add_option<TimeRepresentation<count_time<9,_long>_>,_TimeRepresentation<count_time<9,_long>_>,_(CLI::detail::enabler)0>
            (pAVar1,&local_e0,(TimeRepresentation<count_time<9,_long>_> *)(in_RSI + 0x18),&local_100
            );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  pAVar1 = (App *)this->_vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"--input,input",&local_1a3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,"The primary input file containing app configuration",&local_1a1);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_120,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x40),&local_140);
  CLI::Validator::Validator(&local_80,(Validator *)CLI::ExistingFile);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"",&local_1a2);
  CLI::Option::check(pOVar3,&local_80,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  CLI::Validator::~Validator(&local_80);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_120);
  pAVar1 = (App *)this->_vptr_App;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,"--output,-o",(allocator<char> *)&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,"the output file for recording the data",&local_1a3);
  pOVar3 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (pAVar1,&local_160,
                      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (in_RSI + 0x60),&local_180);
  CLI::Option::capture_default_str(pOVar3);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_160);
  pp_Var2 = this->_vptr_App;
  *(undefined1 *)(pp_Var2 + 9) = 1;
  *(undefined1 *)((long)pp_Var2 + 0x2df) = 1;
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<helicsCLI11App> App::generateParser()
{
    auto app =
        std::make_unique<helicsCLI11App>("Common options for all Helics Apps", "[HELICS_APP]");
    app->add_config_validation();
    app->add_flag("--local",
                  useLocal,
                  "Specify otherwise unspecified endpoints and publications as local "
                  "(i.e. the names will be prepended with the app name)");
    app->add_option("--stop", stopTime, "The time to stop the app");
    app->add_option("--input,input",
                    inputFileName,
                    "The primary input file containing app configuration")
        ->check(CLI::ExistingFile);
    app->add_option("--output,-o", outFileName, "the output file for recording the data")
        ->capture_default_str();
    app->allow_extras()->validate_positionals();
    return app;
}